

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O2

char * vrna_read_line(FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  char *p;
  int iVar3;
  uint size;
  int iVar4;
  char s [512];
  
  size = 0;
  p = (char *)0x0;
  iVar4 = 0;
  do {
    pcVar1 = fgets(s,0x200,(FILE *)fp);
    if (pcVar1 == (char *)0x0) {
      return p;
    }
    pcVar1 = strchr(s,10);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    sVar2 = strlen(s);
    iVar3 = iVar4 + (int)sVar2;
    if ((int)size <= iVar3) {
      size = (uint)((double)(iVar3 + 1) * 1.2);
      p = (char *)vrna_realloc(p,size);
    }
    memcpy(p + iVar4,s,(long)(int)sVar2);
    p[iVar3] = '\0';
    iVar4 = iVar3;
  } while (pcVar1 == (char *)0x0);
  return p;
}

Assistant:

PUBLIC char *
vrna_read_line(FILE *fp)
{
  /* reads lines of arbitrary length from fp */

  char  s[512], *line, *cp;
  int   len = 0, size = 0, l, l2;

  line = NULL;
  do {
    if (fgets(s, 512, fp) == NULL)
      break;

    cp = strchr(s, '\n');
    if (cp != NULL)
      *cp = '\0';

    l2  = (int)strlen(s);
    l   = len + l2;
    if (l + 1 > size) {
      size  = (int)((l + 1) * 1.2);
      line  = (char *)vrna_realloc(line, size * sizeof(char));
    }
    memcpy(line + len,
           s,
           sizeof(char) * l2);

    line[l] = '\0';
    len = l;
  } while (cp == NULL);

  return line;
}